

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOpt.cpp
# Opt level: O1

void __thiscall GlobOpt::Optimize(GlobOpt *this)

{
  ArgSlot *pAVar1;
  BVSparseNode **this_00;
  Func *pFVar2;
  PropertyEquivBvMap *pPVar3;
  Type piVar4;
  PageAllocator *pageAllocator;
  bool bVar5;
  ArgSlot AVar6;
  uint uVar7;
  uint uVar8;
  SymID SVar9;
  JITTimeFunctionBody *this_01;
  BVSparse<Memory::JitArenaAllocator> *pBVar10;
  Type pDVar11;
  uint uVar12;
  undefined1 local_138 [8];
  NoRecoverMemoryJitArenaAllocator localAlloc;
  NoRecoverMemoryJitArenaAllocator localTempAlloc;
  
  this->objectTypeSyms = (BVSparse<Memory::JitArenaAllocator> *)0x0;
  AVar6 = Func::GetInParamsCount(this->func);
  pFVar2 = this->func;
  pFVar2->argInsCount = AVar6;
  this_01 = JITTimeWorkItem::GetJITFunctionBody(pFVar2->m_workItem);
  bVar5 = JITTimeFunctionBody::IsAsmJsMode(this_01);
  if (!bVar5) {
    pAVar1 = &this->func->argInsCount;
    *pAVar1 = *pAVar1 - 1;
  }
  bVar5 = Func::DoGlobOpt(this->func);
  if (!bVar5) {
    this->lengthEquivBv = (BVSparse<Memory::JitArenaAllocator> *)0x0;
    this->argumentsEquivBv = (BVSparse<Memory::JitArenaAllocator> *)0x0;
    this->callerEquivBv = (BVSparse<Memory::JitArenaAllocator> *)0x0;
    BackwardPass(this,DeadStorePhase);
    CannotAllocateArgumentsObjectOnStack(this,(Func *)0x0);
    return;
  }
  pPVar3 = this->func->m_symTable->m_propertyEquivBvMap;
  piVar4 = pPVar3->buckets;
  uVar7 = 0;
  if (piVar4 != (Type)0x0) {
    uVar7 = JsUtil::
            BaseDictionary<int,_BVSparse<Memory::JitArenaAllocator>_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
            ::GetBucket(0x1a3,pPVar3->bucketCount,pPVar3->modFunctionIndex);
    uVar12 = piVar4[uVar7];
    uVar7 = 0;
    if (-1 < (int)uVar12) {
      uVar7 = 0;
      do {
        if (pPVar3->entries[uVar12].
            super_DefaultHashedEntry<int,_BVSparse<Memory::JitArenaAllocator>_*,_JsUtil::(anonymous_namespace)::KeyValueEntry>
            .super_KeyValueEntry<int,_BVSparse<Memory::JitArenaAllocator>_*>.
            super_ValueEntry<BVSparse<Memory::JitArenaAllocator>_*,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<int,_BVSparse<Memory::JitArenaAllocator>_*>_>
            .super_KeyValueEntryDataLayout2<int,_BVSparse<Memory::JitArenaAllocator>_*>.key == 0xd1)
        {
          pDVar11 = pPVar3->stats;
          goto LAB_0043dad4;
        }
        uVar7 = uVar7 + 1;
        uVar12 = pPVar3->entries[uVar12].
                 super_DefaultHashedEntry<int,_BVSparse<Memory::JitArenaAllocator>_*,_JsUtil::(anonymous_namespace)::KeyValueEntry>
                 .super_KeyValueEntry<int,_BVSparse<Memory::JitArenaAllocator>_*>.
                 super_ValueEntry<BVSparse<Memory::JitArenaAllocator>_*,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<int,_BVSparse<Memory::JitArenaAllocator>_*>_>
                 .super_KeyValueEntryDataLayout2<int,_BVSparse<Memory::JitArenaAllocator>_*>.next;
      } while (-1 < (int)uVar12);
    }
  }
  pDVar11 = pPVar3->stats;
  uVar12 = 0xffffffff;
LAB_0043dad4:
  if (pDVar11 != (DictionaryStats *)0x0) {
    DictionaryStats::Lookup(pDVar11,uVar7);
  }
  uVar7 = 0;
  if ((int)uVar12 < 0) {
    pBVar10 = (BVSparse<Memory::JitArenaAllocator> *)0x0;
  }
  else {
    pBVar10 = pPVar3->entries[uVar12].
              super_DefaultHashedEntry<int,_BVSparse<Memory::JitArenaAllocator>_*,_JsUtil::(anonymous_namespace)::KeyValueEntry>
              .super_KeyValueEntry<int,_BVSparse<Memory::JitArenaAllocator>_*>.
              super_ValueEntry<BVSparse<Memory::JitArenaAllocator>_*,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<int,_BVSparse<Memory::JitArenaAllocator>_*>_>
              .super_KeyValueEntryDataLayout2<int,_BVSparse<Memory::JitArenaAllocator>_*>.value;
  }
  this->lengthEquivBv = pBVar10;
  pPVar3 = this->func->m_symTable->m_propertyEquivBvMap;
  piVar4 = pPVar3->buckets;
  if (piVar4 != (Type)0x0) {
    uVar8 = JsUtil::
            BaseDictionary<int,_BVSparse<Memory::JitArenaAllocator>_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
            ::GetBucket(0x39f,pPVar3->bucketCount,pPVar3->modFunctionIndex);
    uVar12 = piVar4[uVar8];
    if (-1 < (int)uVar12) {
      uVar7 = 0;
      do {
        if (pPVar3->entries[uVar12].
            super_DefaultHashedEntry<int,_BVSparse<Memory::JitArenaAllocator>_*,_JsUtil::(anonymous_namespace)::KeyValueEntry>
            .super_KeyValueEntry<int,_BVSparse<Memory::JitArenaAllocator>_*>.
            super_ValueEntry<BVSparse<Memory::JitArenaAllocator>_*,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<int,_BVSparse<Memory::JitArenaAllocator>_*>_>
            .super_KeyValueEntryDataLayout2<int,_BVSparse<Memory::JitArenaAllocator>_*>.key == 0x1cf
           ) {
          pDVar11 = pPVar3->stats;
          goto LAB_0043dba7;
        }
        uVar7 = uVar7 + 1;
        uVar12 = pPVar3->entries[uVar12].
                 super_DefaultHashedEntry<int,_BVSparse<Memory::JitArenaAllocator>_*,_JsUtil::(anonymous_namespace)::KeyValueEntry>
                 .super_KeyValueEntry<int,_BVSparse<Memory::JitArenaAllocator>_*>.
                 super_ValueEntry<BVSparse<Memory::JitArenaAllocator>_*,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<int,_BVSparse<Memory::JitArenaAllocator>_*>_>
                 .super_KeyValueEntryDataLayout2<int,_BVSparse<Memory::JitArenaAllocator>_*>.next;
      } while (-1 < (int)uVar12);
    }
  }
  pDVar11 = pPVar3->stats;
  uVar12 = 0xffffffff;
LAB_0043dba7:
  if (pDVar11 != (DictionaryStats *)0x0) {
    DictionaryStats::Lookup(pDVar11,uVar7);
  }
  uVar7 = 0;
  if ((int)uVar12 < 0) {
    pBVar10 = (BVSparse<Memory::JitArenaAllocator> *)0x0;
  }
  else {
    pBVar10 = pPVar3->entries[uVar12].
              super_DefaultHashedEntry<int,_BVSparse<Memory::JitArenaAllocator>_*,_JsUtil::(anonymous_namespace)::KeyValueEntry>
              .super_KeyValueEntry<int,_BVSparse<Memory::JitArenaAllocator>_*>.
              super_ValueEntry<BVSparse<Memory::JitArenaAllocator>_*,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<int,_BVSparse<Memory::JitArenaAllocator>_*>_>
              .super_KeyValueEntryDataLayout2<int,_BVSparse<Memory::JitArenaAllocator>_*>.value;
  }
  this->argumentsEquivBv = pBVar10;
  pPVar3 = this->func->m_symTable->m_propertyEquivBvMap;
  piVar4 = pPVar3->buckets;
  if (piVar4 != (Type)0x0) {
    uVar8 = JsUtil::
            BaseDictionary<int,_BVSparse<Memory::JitArenaAllocator>_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
            ::GetBucket(0x39b,pPVar3->bucketCount,pPVar3->modFunctionIndex);
    uVar12 = piVar4[uVar8];
    if (-1 < (int)uVar12) {
      uVar7 = 0;
      do {
        if (pPVar3->entries[uVar12].
            super_DefaultHashedEntry<int,_BVSparse<Memory::JitArenaAllocator>_*,_JsUtil::(anonymous_namespace)::KeyValueEntry>
            .super_KeyValueEntry<int,_BVSparse<Memory::JitArenaAllocator>_*>.
            super_ValueEntry<BVSparse<Memory::JitArenaAllocator>_*,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<int,_BVSparse<Memory::JitArenaAllocator>_*>_>
            .super_KeyValueEntryDataLayout2<int,_BVSparse<Memory::JitArenaAllocator>_*>.key == 0x1cd
           ) {
          pDVar11 = pPVar3->stats;
          goto LAB_0043dc42;
        }
        uVar7 = uVar7 + 1;
        uVar12 = pPVar3->entries[uVar12].
                 super_DefaultHashedEntry<int,_BVSparse<Memory::JitArenaAllocator>_*,_JsUtil::(anonymous_namespace)::KeyValueEntry>
                 .super_KeyValueEntry<int,_BVSparse<Memory::JitArenaAllocator>_*>.
                 super_ValueEntry<BVSparse<Memory::JitArenaAllocator>_*,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<int,_BVSparse<Memory::JitArenaAllocator>_*>_>
                 .super_KeyValueEntryDataLayout2<int,_BVSparse<Memory::JitArenaAllocator>_*>.next;
      } while (-1 < (int)uVar12);
    }
  }
  pDVar11 = pPVar3->stats;
  uVar12 = 0xffffffff;
LAB_0043dc42:
  if (pDVar11 != (DictionaryStats *)0x0) {
    DictionaryStats::Lookup(pDVar11,uVar7);
  }
  if ((int)uVar12 < 0) {
    pBVar10 = (BVSparse<Memory::JitArenaAllocator> *)0x0;
  }
  else {
    pBVar10 = pPVar3->entries[uVar12].
              super_DefaultHashedEntry<int,_BVSparse<Memory::JitArenaAllocator>_*,_JsUtil::(anonymous_namespace)::KeyValueEntry>
              .super_KeyValueEntry<int,_BVSparse<Memory::JitArenaAllocator>_*>.
              super_ValueEntry<BVSparse<Memory::JitArenaAllocator>_*,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<int,_BVSparse<Memory::JitArenaAllocator>_*>_>
              .super_KeyValueEntryDataLayout2<int,_BVSparse<Memory::JitArenaAllocator>_*>.value;
  }
  this->callerEquivBv = pBVar10;
  pageAllocator =
       (this->func->m_alloc->super_ArenaAllocator).
       super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>.super_ArenaData.
       pageAllocator;
  Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::ArenaAllocatorBase
            ((ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *)local_138,
             L"BE-GlobOpt",pageAllocator,Js::Throw::OutOfMemory,(_func_void *)0x0);
  localAlloc.super_JitArenaAllocator.super_ArenaAllocator.
  super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>.freeList = (void *)0x0;
  this->alloc = (JitArenaAllocator *)local_138;
  this_00 = &localAlloc.super_JitArenaAllocator.bvFreeList;
  Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::ArenaAllocatorBase
            ((ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *)this_00,
             L"BE-GlobOpt temp",pageAllocator,Js::Throw::OutOfMemory,(_func_void *)0x0);
  this->tempAlloc = (JitArenaAllocator *)this_00;
  SVar9 = SymTable::GetMaxSymID(this->func->m_symTable);
  this->maxInitialSymID = SVar9;
  BackwardPass(this,CaptureByteCodeRegUsePhase);
  BackwardPass(this,BackwardPhase);
  ForwardPass(this);
  BackwardPass(this,DeadStorePhase);
  Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::~ArenaAllocatorBase
            ((ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *)
             &localAlloc.super_JitArenaAllocator.bvFreeList);
  Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::~ArenaAllocatorBase
            ((ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *)local_138);
  TailDupPass(this);
  return;
}

Assistant:

void
GlobOpt::Optimize()
{
    this->objectTypeSyms = nullptr;

    this->func->argInsCount = this->func->GetInParamsCount();
    if (!func->GetJITFunctionBody()->IsAsmJsMode())
    {
        // Don't include "this" pointer in the count when not in AsmJs mode (AsmJS does not have "this").
        this->func->argInsCount--;
    }

    if (!func->DoGlobOpt())
    {
        this->lengthEquivBv = nullptr;
        this->argumentsEquivBv = nullptr;
        this->callerEquivBv = nullptr;

        // Still need to run the dead store phase to calculate the live reg on back edge
        this->BackwardPass(Js::DeadStorePhase);
        CannotAllocateArgumentsObjectOnStack(nullptr);
        return;
    }

    {
        this->lengthEquivBv = this->func->m_symTable->m_propertyEquivBvMap->Lookup(Js::PropertyIds::length, nullptr); // Used to kill live "length" properties
        this->argumentsEquivBv = func->m_symTable->m_propertyEquivBvMap->Lookup(Js::PropertyIds::arguments, nullptr); // Used to kill live "arguments" properties
        this->callerEquivBv = func->m_symTable->m_propertyEquivBvMap->Lookup(Js::PropertyIds::caller, nullptr); // Used to kill live "caller" properties

        // The backward phase needs the glob opt's allocator to allocate the propertyTypeValueMap
        // in GlobOpt::EnsurePropertyTypeValue and ranges of instructions where int overflow may be ignored.
        // (see BackwardPass::TrackIntUsage)
        PageAllocator * pageAllocator = this->func->m_alloc->GetPageAllocator();
        NoRecoverMemoryJitArenaAllocator localAlloc(_u("BE-GlobOpt"), pageAllocator, Js::Throw::OutOfMemory);
        this->alloc = &localAlloc;

        NoRecoverMemoryJitArenaAllocator localTempAlloc(_u("BE-GlobOpt temp"), pageAllocator, Js::Throw::OutOfMemory);
        this->tempAlloc = &localTempAlloc;

        // The forward passes use info (upwardExposedUses) from the backward pass. This info
        // isn't available for some of the symbols created during the backward pass, or the forward pass.
        // Keep track of the last symbol for which we're guaranteed to have data.
        this->maxInitialSymID = this->func->m_symTable->GetMaxSymID();
#if DBG
        this->BackwardPass(Js::CaptureByteCodeRegUsePhase);
#endif
        this->BackwardPass(Js::BackwardPhase);
        this->ForwardPass();
        this->BackwardPass(Js::DeadStorePhase);
    }
    this->TailDupPass();
}